

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O3

Num3072 * __thiscall
MuHash3072::ToNum3072(Num3072 *__return_storage_ptr__,MuHash3072 *this,Span<const_unsigned_char> in)

{
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  Span<std::byte> output;
  uint256 hashed_in;
  uchar tmp [384];
  ChaCha20Aligned CStack_1f8;
  byte local_1c8 [32];
  CSHA256 local_1a8 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a8[0].buf[0x30] = '\0';
  local_1a8[0].buf[0x31] = '\0';
  local_1a8[0].buf[0x32] = '\0';
  local_1a8[0].buf[0x33] = '\0';
  local_1a8[0].buf[0x34] = '\0';
  local_1a8[0].buf[0x35] = '\0';
  local_1a8[0].buf[0x36] = '\0';
  local_1a8[0].buf[0x37] = '\0';
  local_1a8[0].buf[0x38] = '\0';
  local_1a8[0].buf[0x39] = '\0';
  local_1a8[0].buf[0x3a] = '\0';
  local_1a8[0].buf[0x3b] = '\0';
  local_1a8[0].buf[0x3c] = '\0';
  local_1a8[0].buf[0x3d] = '\0';
  local_1a8[0].buf[0x3e] = '\0';
  local_1a8[0].buf[0x3f] = '\0';
  local_1a8[0].buf[0x20] = '\0';
  local_1a8[0].buf[0x21] = '\0';
  local_1a8[0].buf[0x22] = '\0';
  local_1a8[0].buf[0x23] = '\0';
  local_1a8[0].buf[0x24] = '\0';
  local_1a8[0].buf[0x25] = '\0';
  local_1a8[0].buf[0x26] = '\0';
  local_1a8[0].buf[0x27] = '\0';
  local_1a8[0].buf[0x28] = '\0';
  local_1a8[0].buf[0x29] = '\0';
  local_1a8[0].buf[0x2a] = '\0';
  local_1a8[0].buf[0x2b] = '\0';
  local_1a8[0].buf[0x2c] = '\0';
  local_1a8[0].buf[0x2d] = '\0';
  local_1a8[0].buf[0x2e] = '\0';
  local_1a8[0].buf[0x2f] = '\0';
  local_1a8[0].buf[0x10] = '\0';
  local_1a8[0].buf[0x11] = '\0';
  local_1a8[0].buf[0x12] = '\0';
  local_1a8[0].buf[0x13] = '\0';
  local_1a8[0].buf[0x14] = '\0';
  local_1a8[0].buf[0x15] = '\0';
  local_1a8[0].buf[0x16] = '\0';
  local_1a8[0].buf[0x17] = '\0';
  local_1a8[0].buf[0x18] = '\0';
  local_1a8[0].buf[0x19] = '\0';
  local_1a8[0].buf[0x1a] = '\0';
  local_1a8[0].buf[0x1b] = '\0';
  local_1a8[0].buf[0x1c] = '\0';
  local_1a8[0].buf[0x1d] = '\0';
  local_1a8[0].buf[0x1e] = '\0';
  local_1a8[0].buf[0x1f] = '\0';
  local_1a8[0].buf[0] = '\0';
  local_1a8[0].buf[1] = '\0';
  local_1a8[0].buf[2] = '\0';
  local_1a8[0].buf[3] = '\0';
  local_1a8[0].buf[4] = '\0';
  local_1a8[0].buf[5] = '\0';
  local_1a8[0].buf[6] = '\0';
  local_1a8[0].buf[7] = '\0';
  local_1a8[0].buf[8] = '\0';
  local_1a8[0].buf[9] = '\0';
  local_1a8[0].buf[10] = '\0';
  local_1a8[0].buf[0xb] = '\0';
  local_1a8[0].buf[0xc] = '\0';
  local_1a8[0].buf[0xd] = '\0';
  local_1a8[0].buf[0xe] = '\0';
  local_1a8[0].buf[0xf] = '\0';
  local_1a8[0].s[4] = 0;
  local_1a8[0].s[5] = 0;
  local_1a8[0].s[6] = 0;
  local_1a8[0].s[7] = 0;
  local_1a8[0].s[0] = 0;
  local_1a8[0].s[1] = 0;
  local_1a8[0].s[2] = 0;
  local_1a8[0].s[3] = 0;
  local_1a8[0].bytes = 0;
  CSHA256::CSHA256(local_1a8);
  CSHA256::Write(local_1a8,in.m_data,in.m_size);
  local_1c8[0] = 0;
  local_1c8[1] = 0;
  local_1c8[2] = 0;
  local_1c8[3] = 0;
  local_1c8[4] = 0;
  local_1c8[5] = 0;
  local_1c8[6] = 0;
  local_1c8[7] = 0;
  local_1c8[8] = 0;
  local_1c8[9] = 0;
  local_1c8[10] = 0;
  local_1c8[0xb] = 0;
  local_1c8[0xc] = 0;
  local_1c8[0xd] = 0;
  local_1c8[0xe] = 0;
  local_1c8[0xf] = 0;
  local_1c8[0x10] = 0;
  local_1c8[0x11] = 0;
  local_1c8[0x12] = 0;
  local_1c8[0x13] = 0;
  local_1c8[0x14] = 0;
  local_1c8[0x15] = 0;
  local_1c8[0x16] = 0;
  local_1c8[0x17] = 0;
  local_1c8[0x18] = 0;
  local_1c8[0x19] = 0;
  local_1c8[0x1a] = 0;
  local_1c8[0x1b] = 0;
  local_1c8[0x1c] = 0;
  local_1c8[0x1d] = 0;
  local_1c8[0x1e] = 0;
  local_1c8[0x1f] = 0;
  CSHA256::Finalize(local_1a8,local_1c8);
  key.m_size = 0x20;
  key.m_data = local_1c8;
  ChaCha20Aligned::ChaCha20Aligned(&CStack_1f8,key);
  output.m_size = 0x180;
  output.m_data = (byte *)local_1a8;
  ChaCha20Aligned::Keystream(&CStack_1f8,output);
  ChaCha20Aligned::~ChaCha20Aligned(&CStack_1f8);
  Num3072::Num3072(__return_storage_ptr__,(uchar (*) [384])local_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Num3072 MuHash3072::ToNum3072(Span<const unsigned char> in) {
    unsigned char tmp[Num3072::BYTE_SIZE];

    uint256 hashed_in{(HashWriter{} << in).GetSHA256()};
    static_assert(sizeof(tmp) % ChaCha20Aligned::BLOCKLEN == 0);
    ChaCha20Aligned{MakeByteSpan(hashed_in)}.Keystream(MakeWritableByteSpan(tmp));
    Num3072 out{tmp};

    return out;
}